

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# differentiable.cxx
# Opt level: O0

void __thiscall DifferentialEquation::stepEulerIto(DifferentialEquation *this)

{
  reference ppSVar1;
  reference ppSVar2;
  double dVar3;
  double dVar4;
  double integrator;
  double integrand;
  int i;
  DifferentialEquation *this_local;
  
  this->eqnIncrement = 0.0;
  for (integrand._4_4_ = 0; integrand._4_4_ < this->eqnTermAmount;
      integrand._4_4_ = integrand._4_4_ + 1) {
    ppSVar1 = std::vector<StochasticFunction_*,_std::allocator<StochasticFunction_*>_>::operator[]
                        (&this->eqnIntegrands,(long)integrand._4_4_);
    dVar3 = StochasticFunction::operator()
                      (*ppSVar1,(this->super_StochasticVariable).super_StochasticProcess.
                                stochCurrentValue);
    ppSVar2 = std::vector<StochasticVariable_*,_std::allocator<StochasticVariable_*>_>::operator[]
                        (&this->eqnIntegrators,(long)integrand._4_4_);
    dVar4 = StochasticVariable::d(*ppSVar2);
    this->eqnIncrement = dVar3 * dVar4 + this->eqnIncrement;
  }
  (this->super_StochasticVariable).super_StochasticProcess.stochNextValue =
       (this->super_StochasticVariable).super_StochasticProcess.stochCurrentValue +
       this->eqnIncrement;
  return;
}

Assistant:

void DifferentialEquation::stepEulerIto()
{
	// cout << "Ito method" << endl;
	
	// calculate new diff
	eqnIncrement = 0.0;
	for(int i=0; i<eqnTermAmount; ++i) {
		double integrand = (*eqnIntegrands[i])(stochCurrentValue);
		double integrator = (*eqnIntegrators[i]).d();
		eqnIncrement +=  integrand * integrator;
	// 	cout << "integrand " << i << ": " << integrand
	// 		<< " integrator " << i << ": " << integrator << endl;
	}
	
	stochNextValue = stochCurrentValue + eqnIncrement;
	// cout << "DifferentialEquation::stochNextValue = " << stochNextValue << endl;
}